

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

word extract_bits(word in,word mask)

{
  word bb;
  word res;
  word mask_local;
  word in_local;
  
  res = 0;
  bb = 1;
  for (mask_local = mask; mask_local != 0; mask_local = mask_local - 1 & mask_local) {
    res = bb & -(long)(int)(uint)((in & mask_local & -mask_local) != 0) | res;
    bb = bb << 1;
  }
  return res;
}

Assistant:

static word extract_bits(word in, word mask) {
  word res = 0;
  for (word bb = 1; mask != 0; bb <<= 1, mask &= (mask - 1)) {
    res |= bb & (-((word) !!(in & mask & -mask)));
  }
  return res;
}